

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BKPT(DisasContext_conflict1 *s,arg_BKPT *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  int iVar2;
  uintptr_t o;
  TCGv_i32 pTVar3;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    iVar2 = a->imm;
    tcg_ctx = s->uc->tcg_ctx;
    gen_set_condexec(s);
    gen_set_pc_im(s,s->pc_curr);
    pTVar3 = tcg_const_i32_aarch64(tcg_ctx,(ushort)iVar2 | 0xe2000000);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_exception_bkpt_insn_aarch64,(TCGTemp *)0x0,2,&local_38);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    (s->base).is_jmp = DISAS_NORETURN;
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_BKPT(DisasContext *s, arg_BKPT *a)
{
    if (!ENABLE_ARCH_5) {
        return false;
    }
    if (arm_dc_feature(s, ARM_FEATURE_M) && false && // semihosting_enabled() &&
        !IS_USER(s) &&
        (a->imm == 0xab)) {
        gen_exception_internal_insn(s, s->pc_curr, EXCP_SEMIHOST);
    } else {
        gen_exception_bkpt_insn(s, syn_aa32_bkpt(a->imm, false));
    }
    return true;
}